

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matdet.c
# Opt level: O2

double mat_cofact(MATRIX A,int i,int j)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar1 = signa[(j + i) % 2];
  dVar2 = A[i][j];
  dVar3 = mat_minor(A,i,j);
  return dVar3 * dVar1 * dVar2;
}

Assistant:

double mat_cofact( MATRIX A, int i, int j )
{
	double	result;

	result = signa[(i+j)%2] * A[i][j] * mat_minor(A, i, j);

	return (result);
}